

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptFunction::IsScriptFunction(JavascriptFunction *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  FunctionInfo **ppFVar4;
  undefined4 *puVar5;
  FunctionInfo *this_00;
  JavascriptFunction *this_local;
  
  ppFVar4 = Memory::WriteBarrierPtr::operator_cast_to_FunctionInfo__
                      ((WriteBarrierPtr *)&this->functionInfo);
  if (*ppFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x5f,"(functionInfo != nullptr)","functionInfo != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(&this->functionInfo);
  BVar3 = FunctionInfo::HasBody(this_00);
  return BVar3;
}

Assistant:

BOOL JavascriptFunction::IsScriptFunction() const
    {
        Assert(functionInfo != nullptr);
        return functionInfo->HasBody();
    }